

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

UNewTrie *
utrie_open_63(UNewTrie *fillIn,uint32_t *aliasData,int32_t maxDataLength,uint32_t initialValue,
             uint32_t leadUnitValue,UBool latin1Linear)

{
  UBool UVar1;
  uint uVar2;
  UNewTrie *__s;
  ulong uVar3;
  
  if ((maxDataLength < 0x20) || ((uint)maxDataLength < 0x400 && latin1Linear != '\0')) {
LAB_002fae33:
    __s = (UNewTrie *)0x0;
  }
  else {
    __s = fillIn;
    if (fillIn == (UNewTrie *)0x0) {
      __s = (UNewTrie *)uprv_malloc_63(0x44120);
      if (__s == (UNewTrie *)0x0) goto LAB_002fae33;
    }
    memset(__s,0,0x44120);
    __s->isAllocated = fillIn == (UNewTrie *)0x0;
    if (aliasData == (uint32_t *)0x0) {
      aliasData = (uint32_t *)uprv_malloc_63((ulong)(uint)(maxDataLength * 4));
      __s->data = aliasData;
      if (aliasData == (uint32_t *)0x0) {
        uprv_free_63(__s);
        goto LAB_002fae33;
      }
      UVar1 = '\x01';
    }
    else {
      __s->data = aliasData;
      UVar1 = '\0';
    }
    __s->isDataAllocated = UVar1;
    if (latin1Linear == '\0') {
      uVar2 = 0x20;
    }
    else {
      __s->index[0] = 0x20;
      __s->index[1] = 0x40;
      __s->index[2] = 0x60;
      __s->index[3] = 0x80;
      __s->index[4] = 0xa0;
      __s->index[5] = 0xc0;
      __s->index[6] = 0xe0;
      __s->index[7] = 0x100;
      uVar2 = 0x120;
    }
    __s->dataLength = uVar2;
    for (uVar3 = (ulong)uVar2; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
      aliasData[uVar3 - 1] = initialValue;
    }
    __s->leadUnitValue = leadUnitValue;
    __s->indexLength = 0x8800;
    __s->dataCapacity = maxDataLength;
    __s->isLatin1Linear = latin1Linear;
    __s->isCompacted = '\0';
  }
  return __s;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_open(UNewTrie *fillIn,
           uint32_t *aliasData, int32_t maxDataLength,
           uint32_t initialValue, uint32_t leadUnitValue,
           UBool latin1Linear) {
    UNewTrie *trie;
    int32_t i, j;

    if( maxDataLength<UTRIE_DATA_BLOCK_LENGTH ||
        (latin1Linear && maxDataLength<1024)
    ) {
        return NULL;
    }

    if(fillIn!=NULL) {
        trie=fillIn;
    } else {
        trie=(UNewTrie *)uprv_malloc(sizeof(UNewTrie));
        if(trie==NULL) {
            return NULL;
        }
    }
    uprv_memset(trie, 0, sizeof(UNewTrie));
    trie->isAllocated= (UBool)(fillIn==NULL);

    if(aliasData!=NULL) {
        trie->data=aliasData;
        trie->isDataAllocated=FALSE;
    } else {
        trie->data=(uint32_t *)uprv_malloc(maxDataLength*4);
        if(trie->data==NULL) {
            uprv_free(trie);
            return NULL;
        }
        trie->isDataAllocated=TRUE;
    }

    /* preallocate and reset the first data block (block index 0) */
    j=UTRIE_DATA_BLOCK_LENGTH;

    if(latin1Linear) {
        /* preallocate and reset the first block (number 0) and Latin-1 (U+0000..U+00ff) after that */
        /* made sure above that maxDataLength>=1024 */

        /* set indexes to point to consecutive data blocks */
        i=0;
        do {
            /* do this at least for trie->index[0] even if that block is only partly used for Latin-1 */
            trie->index[i++]=j;
            j+=UTRIE_DATA_BLOCK_LENGTH;
        } while(i<(256>>UTRIE_SHIFT));
    }

    /* reset the initially allocated blocks to the initial value */
    trie->dataLength=j;
    while(j>0) {
        trie->data[--j]=initialValue;
    }

    trie->leadUnitValue=leadUnitValue;
    trie->indexLength=UTRIE_MAX_INDEX_LENGTH;
    trie->dataCapacity=maxDataLength;
    trie->isLatin1Linear=latin1Linear;
    trie->isCompacted=FALSE;
    return trie;
}